

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

int __thiscall
TGenericArray<unsigned_char>::LoadFromStream
          (TGenericArray<unsigned_char> *this,TByteStream *InStream)

{
  DWORD local_24;
  int nError;
  DWORD NumberOfBytes;
  TByteStream *InStream_local;
  TGenericArray<unsigned_char> *this_local;
  
  _nError = InStream;
  InStream_local = (TByteStream *)this;
  this_local._4_4_ =
       TByteStream::GetArrayItemCount<unsigned_char>(InStream,&local_24,&this->ItemCount);
  if (((this_local._4_4_ == 0) &&
      (this_local._4_4_ =
            TByteStream::GetArray<unsigned_char>(_nError,&this->ItemArray,(ulong)this->ItemCount),
      this_local._4_4_ == 0)) &&
     (this_local._4_4_ = TByteStream::SkipBytes(_nError,(ulong)(-local_24 & 7)),
     this_local._4_4_ == 0)) {
    this_local._4_4_ = SetArrayValid(this);
  }
  return this_local._4_4_;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD NumberOfBytes;
        int nError;

        // Get and verify the number of items
        nError = InStream.GetArrayItemCount<T>(NumberOfBytes, ItemCount);
        if(nError != ERROR_SUCCESS)
            return nError;

        // Get the pointer to the array
        nError = InStream.GetArray<T>(&ItemArray, ItemCount);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.SkipBytes((0 - (DWORD)NumberOfBytes) & 0x07);
        if(nError != ERROR_SUCCESS)
            return nError;

        return SetArrayValid();
    }